

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

void __thiscall
flatbuffers::dart::DartGenerator::GenImplementationGetters
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *code)

{
  Value *value;
  bool bVar1;
  FieldDef *def;
  Namespace *pNVar2;
  EnumDef *this_00;
  EnumVal *ev;
  pointer ppVar3;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer ppEVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  IdlNamer *local_1d0;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_1c8;
  string field_name;
  string enum_name;
  string defaultValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string type_name;
  string local_50;
  
  local_1d0 = &this->namer_;
  local_1c8 = non_deprecated_fields;
  for (ppVar3 = (non_deprecated_fields->
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != (local_1c8->
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    def = ppVar3->second;
    (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_name,local_1d0,def);
    value = &def->value;
    getDefaultValue_abi_cxx11_(&defaultValue,this,value);
    bVar6 = defaultValue._M_string_length == 0;
    bVar1 = struct_def->fixed;
    pNVar2 = (struct_def->super_Definition).defined_namespace;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"",(allocator<char> *)&enum_name);
    bVar6 = (bool)(bVar6 & (bVar1 ^ 1U));
    GenDartTypeName(&type_name,this,&value->type,pNVar2,def,bVar6,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    GenDocComment(&(def->super_Definition).doc_comment,"  ",code);
    std::operator+(&local_1f0,"  ",&type_name);
    std::operator+(&local_210,&local_1f0," get ");
    std::operator+(&enum_name,&local_210,&field_name);
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&enum_name);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    if ((value->type).base_type == BASE_TYPE_UNION) {
      std::__cxx11::string::append((char *)code);
      std::operator+(&local_210,"    switch (",&field_name);
      std::operator+(&enum_name,&local_210,"Type?.value) {\n");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&enum_name);
      std::__cxx11::string::~string((string *)&local_210);
      this_00 = (def->value).type.enum_def;
      ppEVar5 = (this_00->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (ppEVar5 = ppEVar5 + 1,
            ppEVar5 !=
            (this_00->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
        ev = *ppEVar5;
        NamespaceAliasFromUnionType_abi_cxx11_
                  (&enum_name,this,(this_00->super_Definition).defined_namespace,&ev->union_type);
        EnumDef::ToString_abi_cxx11_(&local_f0,this_00,ev);
        std::operator+(&local_d0,"      case ",&local_f0);
        std::operator+(&local_b0,&local_d0,": return ");
        std::operator+(&local_150,&local_b0,&enum_name);
        std::operator+(&local_90,&local_150,".reader.vTableGetNullable(_bc, _bcOffset, ");
        NumToString<unsigned_short>(&local_110,(def->value).offset);
        std::operator+(&local_1f0,&local_90,&local_110);
        std::operator+(&local_210,&local_1f0,");\n");
        std::__cxx11::string::append((string *)code);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&enum_name);
      }
      std::__cxx11::string::append((char *)code);
      std::__cxx11::string::append((char *)code);
      std::__cxx11::string::append((char *)code);
    }
    else {
      std::__cxx11::string::append((char *)code);
      if (((def->value).type.enum_def != (EnumDef *)0x0) &&
         ((value->type).base_type != BASE_TYPE_VECTOR)) {
        pNVar2 = (struct_def->super_Definition).defined_namespace;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"",(allocator<char> *)&local_1f0);
        GenDartTypeName(&local_210,this,&value->type,pNVar2,def,&local_130);
        __rhs = ".fromValue(";
        if (bVar6 != false) {
          __rhs = "._createOrNull(";
        }
        std::operator+(&enum_name,&local_210,__rhs);
        std::__cxx11::string::append((string *)code);
        std::__cxx11::string::~string((string *)&enum_name);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_130);
      }
      GenReaderTypeName_abi_cxx11_
                (&enum_name,this,&value->type,(struct_def->super_Definition).defined_namespace,def,
                 false,true,true);
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&enum_name);
      if (struct_def->fixed == true) {
        NumToString<unsigned_short>(&local_1f0,(def->value).offset);
        std::operator+(&local_210,".read(_bc, _bcOffset + ",&local_1f0);
        std::operator+(&enum_name,&local_210,")");
        std::__cxx11::string::append((string *)code);
        std::__cxx11::string::~string((string *)&enum_name);
        std::__cxx11::string::~string((string *)&local_210);
        pbVar4 = &local_1f0;
      }
      else {
        std::__cxx11::string::append((char *)code);
        NumToString<unsigned_short>(&enum_name,(def->value).offset);
        if (bVar6 == false) {
          std::operator+(&local_150,"(_bc, _bcOffset, ",&enum_name);
          std::operator+(&local_90,&local_150,", ");
          std::operator+(&local_1f0,&local_90,&defaultValue);
          std::operator+(&local_210,&local_1f0,")");
          std::__cxx11::string::append((string *)code);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_90);
          pbVar4 = &local_150;
        }
        else {
          std::operator+(&local_1f0,"Nullable(_bc, _bcOffset, ",&enum_name);
          std::operator+(&local_210,&local_1f0,")");
          std::__cxx11::string::append((string *)code);
          std::__cxx11::string::~string((string *)&local_210);
          pbVar4 = &local_1f0;
        }
        std::__cxx11::string::~string((string *)pbVar4);
        pbVar4 = &enum_name;
      }
      std::__cxx11::string::~string((string *)pbVar4);
      if (((def->value).type.enum_def != (EnumDef *)0x0) &&
         ((value->type).base_type != BASE_TYPE_VECTOR)) {
        std::__cxx11::string::append((char *)code);
      }
      std::__cxx11::string::append((char *)code);
    }
    std::__cxx11::string::~string((string *)&type_name);
    std::__cxx11::string::~string((string *)&defaultValue);
    std::__cxx11::string::~string((string *)&field_name);
  }
  std::__cxx11::string::append((char *)code);
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&defaultValue,local_1d0,struct_def);
  GenToString(&field_name,this,&defaultValue,local_1c8);
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&field_name);
  std::__cxx11::string::~string((string *)&defaultValue);
  return;
}

Assistant:

void GenImplementationGetters(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      std::string &code) {
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      const std::string field_name = namer_.Field(field);
      const std::string defaultValue = getDefaultValue(field.value);
      const bool isNullable = defaultValue.empty() && !struct_def.fixed;
      const std::string type_name =
          GenDartTypeName(field.value.type, struct_def.defined_namespace, field,
                          isNullable, "");

      GenDocComment(field.doc_comment, "  ", code);

      code += "  " + type_name + " get " + field_name;
      if (field.value.type.base_type == BASE_TYPE_UNION) {
        code += " {\n";
        code += "    switch (" + field_name + "Type?.value) {\n";
        const auto &enum_def = *field.value.type.enum_def;
        for (auto en_it = enum_def.Vals().begin() + 1;
             en_it != enum_def.Vals().end(); ++en_it) {
          const auto &ev = **en_it;
          const auto enum_name = NamespaceAliasFromUnionType(
              enum_def.defined_namespace, ev.union_type);
          code += "      case " + enum_def.ToString(ev) + ": return " +
                  enum_name + ".reader.vTableGetNullable(_bc, _bcOffset, " +
                  NumToString(field.value.offset) + ");\n";
        }
        code += "      default: return null;\n";
        code += "    }\n";
        code += "  }\n";
      } else {
        code += " => ";
        if (field.value.type.enum_def &&
            field.value.type.base_type != BASE_TYPE_VECTOR) {
          code += GenDartTypeName(field.value.type,
                                  struct_def.defined_namespace, field) +
                  (isNullable ? "._createOrNull(" : ".fromValue(");
        }

        code += GenReaderTypeName(field.value.type,
                                  struct_def.defined_namespace, field);
        if (struct_def.fixed) {
          code +=
              ".read(_bc, _bcOffset + " + NumToString(field.value.offset) + ")";
        } else {
          code += ".vTableGet";
          std::string offset = NumToString(field.value.offset);
          if (isNullable) {
            code += "Nullable(_bc, _bcOffset, " + offset + ")";
          } else {
            code += "(_bc, _bcOffset, " + offset + ", " + defaultValue + ")";
          }
        }
        if (field.value.type.enum_def &&
            field.value.type.base_type != BASE_TYPE_VECTOR) {
          code += ")";
        }
        code += ";\n";
      }
    }

    code += "\n";
    code += GenToString(namer_.Type(struct_def), non_deprecated_fields);
  }